

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSImporter::CheckIndices(Discreet3DSImporter *this,Mesh *sMesh)

{
  pointer paVar1;
  pointer paVar2;
  Logger *pLVar3;
  uint uVar4;
  uint a;
  long lVar5;
  pointer pFVar6;
  
  for (pFVar6 = (sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
                super__Vector_impl_data._M_start;
      pFVar6 != (sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
                super__Vector_impl_data._M_finish; pFVar6 = pFVar6 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      uVar4 = (pFVar6->super_FaceWithSmoothingGroup).mIndices[lVar5];
      if ((ulong)(((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0xc) <= (ulong)uVar4) {
        pLVar3 = DefaultLogger::get();
        Logger::warn(pLVar3,"3DS: Vertex index overflow)");
        uVar4 = (int)(((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc) - 1;
        (pFVar6->super_FaceWithSmoothingGroup).mIndices[lVar5] = uVar4;
      }
      paVar1 = (sMesh->mTexCoords).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar2 = (sMesh->mTexCoords).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((paVar1 != paVar2) && ((ulong)(((long)paVar2 - (long)paVar1) / 0xc) <= (ulong)uVar4)) {
        pLVar3 = DefaultLogger::get();
        Logger::warn(pLVar3,"3DS: Texture coordinate index overflow)");
        (pFVar6->super_FaceWithSmoothingGroup).mIndices[lVar5] =
             (int)(((long)(sMesh->mTexCoords).
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(sMesh->mTexCoords).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0xc) - 1;
      }
    }
  }
  return;
}

Assistant:

void Discreet3DSImporter::CheckIndices(D3DS::Mesh& sMesh)
{
    for (std::vector< D3DS::Face >::iterator i =  sMesh.mFaces.begin(); i != sMesh.mFaces.end();++i)
    {
        // check whether all indices are in range
        for (unsigned int a = 0; a < 3;++a)
        {
            if ((*i).mIndices[a] >= sMesh.mPositions.size())
            {
                ASSIMP_LOG_WARN("3DS: Vertex index overflow)");
                (*i).mIndices[a] = (uint32_t)sMesh.mPositions.size()-1;
            }
            if ( !sMesh.mTexCoords.empty() && (*i).mIndices[a] >= sMesh.mTexCoords.size())
            {
                ASSIMP_LOG_WARN("3DS: Texture coordinate index overflow)");
                (*i).mIndices[a] = (uint32_t)sMesh.mTexCoords.size()-1;
            }
        }
    }
}